

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InMemMsgLoader.cpp
# Opt level: O1

void __thiscall xercesc_4_0::InMemMsgLoader::InMemMsgLoader(InMemMsgLoader *this,XMLCh *msgDomain)

{
  short *psVar1;
  XMLCh XVar2;
  XMLCh XVar3;
  long lVar4;
  short *psVar5;
  XMLCh *pXVar6;
  XMLCh *pXVar7;
  size_t __n;
  
  (this->super_XMLMsgLoader)._vptr_XMLMsgLoader = (_func_int **)&PTR__InMemMsgLoader_0041cae8;
  this->fMsgDomain = (XMLCh *)0x0;
  if (msgDomain != L"http://apache.org/xml/messages/XMLErrors") {
    if (msgDomain == (XMLCh *)0x0) {
      psVar5 = &XMLUni::fgXMLErrDomain;
LAB_00349928:
      if ((msgDomain == L"http://apache.org/xml/messages/XML4CErrors") || (*psVar5 == 0))
      goto LAB_00349a21;
    }
    else {
      lVar4 = 0;
      do {
        psVar5 = (short *)((long)msgDomain + lVar4);
        if (*psVar5 == 0) {
          psVar5 = (short *)((long)&XMLUni::fgXMLErrDomain + lVar4);
          goto LAB_00349928;
        }
        psVar1 = (short *)((long)&XMLUni::fgXMLErrDomain + lVar4);
        lVar4 = lVar4 + 2;
      } while (*psVar5 == *psVar1);
      if (msgDomain == L"http://apache.org/xml/messages/XML4CErrors") goto LAB_00349a21;
    }
    if (msgDomain == (XMLCh *)0x0) {
      psVar5 = &XMLUni::fgExceptDomain;
LAB_00349982:
      if ((msgDomain == L"http://apache.org/xml/messages/XMLDOMMsg") || (*psVar5 == 0))
      goto LAB_00349a21;
    }
    else {
      lVar4 = 0;
      do {
        psVar5 = (short *)((long)msgDomain + lVar4);
        if (*psVar5 == 0) {
          psVar5 = (short *)((long)&XMLUni::fgExceptDomain + lVar4);
          goto LAB_00349982;
        }
        psVar1 = (short *)((long)&XMLUni::fgExceptDomain + lVar4);
        lVar4 = lVar4 + 2;
      } while (*psVar5 == *psVar1);
      if (msgDomain == L"http://apache.org/xml/messages/XMLDOMMsg") goto LAB_00349a21;
    }
    if (msgDomain == (XMLCh *)0x0) {
      psVar5 = &XMLUni::fgXMLDOMMsgDomain;
LAB_003499d9:
      if ((msgDomain == L"http://apache.org/xml/messages/XMLValidity") || (*psVar5 == 0))
      goto LAB_00349a21;
    }
    else {
      lVar4 = 0;
      do {
        psVar5 = (short *)((long)msgDomain + lVar4);
        if (*psVar5 == 0) {
          psVar5 = (short *)((long)&XMLUni::fgXMLDOMMsgDomain + lVar4);
          goto LAB_003499d9;
        }
        psVar1 = (short *)((long)&XMLUni::fgXMLDOMMsgDomain + lVar4);
        lVar4 = lVar4 + 2;
      } while (*psVar5 == *psVar1);
      if (msgDomain == L"http://apache.org/xml/messages/XMLValidity") goto LAB_00349a21;
    }
    pXVar6 = L"http://apache.org/xml/messages/XMLValidity";
    pXVar7 = msgDomain;
    if (msgDomain == (XMLCh *)0x0) {
LAB_00349a11:
      if (*pXVar6 == L'\0') goto LAB_00349a21;
    }
    else {
      do {
        XVar2 = *pXVar7;
        if (XVar2 == L'\0') goto LAB_00349a11;
        XVar3 = *pXVar6;
        pXVar6 = pXVar6 + 1;
        pXVar7 = pXVar7 + 1;
      } while (XVar2 == XVar3);
    }
    XMLPlatformUtils::panic(Panic_UnknownMsgDomain);
  }
LAB_00349a21:
  if (msgDomain == (XMLCh *)0x0) {
    pXVar6 = (XMLCh *)0x0;
  }
  else {
    __n = 0;
    do {
      psVar5 = (short *)((long)msgDomain + __n);
      __n = __n + 2;
    } while (*psVar5 != 0);
    pXVar6 = (XMLCh *)(**(code **)(*XMLPlatformUtils::fgMemoryManager + 0x18))
                                (XMLPlatformUtils::fgMemoryManager,__n);
    memcpy(pXVar6,msgDomain,__n);
  }
  this->fMsgDomain = pXVar6;
  return;
}

Assistant:

InMemMsgLoader::InMemMsgLoader(const XMLCh* const msgDomain)
:fMsgDomain(0)
{
    if (!XMLString::equals(msgDomain, XMLUni::fgXMLErrDomain)
    &&  !XMLString::equals(msgDomain, XMLUni::fgExceptDomain)
    &&  !XMLString::equals(msgDomain, XMLUni::fgXMLDOMMsgDomain)
    &&  !XMLString::equals(msgDomain, XMLUni::fgValidityDomain))
    {
        XMLPlatformUtils::panic(PanicHandler::Panic_UnknownMsgDomain);
    }

    fMsgDomain = XMLString::replicate(msgDomain, XMLPlatformUtils::fgMemoryManager);
}